

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O3

void __thiscall bandit::detail::bandit_run_policy::~bandit_run_policy(bandit_run_policy *this)

{
  pointer pcVar1;
  
  (this->super_run_policy)._vptr_run_policy = (_func_int **)&PTR__bandit_run_policy_0011d9e8;
  pcVar1 = (this->only_pattern_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->only_pattern_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->skip_pattern_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->skip_pattern_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

bandit_run_policy(const char* skip_pattern, const char* only_pattern, bool break_on_failure, bool dry_run)
      : run_policy(), skip_pattern_(skip_pattern), only_pattern_(only_pattern),
      break_on_failure_(break_on_failure), dry_run_(dry_run)
    {}